

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_workspace.cpp
# Opt level: O0

void * __thiscall ON_Workspace::GetMemory(ON_Workspace *this,size_t size)

{
  ON_Workspace_MBLK *pOVar1;
  ON_Workspace_MBLK *pBlk;
  void *p;
  size_t size_local;
  ON_Workspace *this_local;
  
  pBlk = (ON_Workspace_MBLK *)0x0;
  if ((size != 0) &&
     (pOVar1 = (ON_Workspace_MBLK *)onmalloc(0x10), pOVar1 != (ON_Workspace_MBLK *)0x0)) {
    pBlk = (ON_Workspace_MBLK *)onmalloc(size);
    pOVar1->pMem = pBlk;
    pOVar1->pNext = this->m_pMemBlk;
    this->m_pMemBlk = pOVar1;
  }
  return pBlk;
}

Assistant:

void* ON_Workspace::GetMemory( size_t size )
{
  void* p = nullptr;
  if ( size > 0 ) 
  {
    struct ON_Workspace_MBLK* pBlk = (struct ON_Workspace_MBLK*)onmalloc(sizeof(*pBlk));
    if ( pBlk ) 
    {
      pBlk->pMem = p = onmalloc(size);
      pBlk->pNext = m_pMemBlk;
      m_pMemBlk = pBlk;
    }
  }
  return p;
}